

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

void SendConAck(int num_connected,int num_needed)

{
  sockaddr_in *to;
  int node;
  long lVar1;
  PreGamePacket packet;
  
  packet.Fake = '0';
  packet.Message = '\x04';
  packet.NumNodes = (BYTE)num_needed;
  packet.field_3.ConsoleNum = (BYTE)num_connected;
  to = sendaddress;
  for (lVar1 = 1; to = to + 1, lVar1 < doomcom.numnodes; lVar1 = lVar1 + 1) {
    PreSend(&packet,4,to);
  }
  (*StartScreen->_vptr_FStartupScreen[6])();
  return;
}

Assistant:

static void SendConAck (int num_connected, int num_needed)
{
	PreGamePacket packet;

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONACK;
	packet.NumNodes = num_needed;
	packet.NumPresent = num_connected;
	for (int node = 1; node < doomcom.numnodes; ++node)
	{
		PreSend (&packet, 4, &sendaddress[node]);
	}
	StartScreen->NetProgress (doomcom.numnodes);
}